

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O3

void __thiscall
capnp::compiler::Lexer::Lexer(Lexer *this,Orphanage orphanageParam,ErrorReporter *errorReporter)

{
  Arena *this_00;
  Parser<kj::Array<Orphan<Token>_>_> *pPVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  undefined8 local_88;
  CharGroup_ local_78;
  CharGroup_ local_58;
  
  (this->orphanage).arena = orphanageParam.arena;
  (this->orphanage).capTable = orphanageParam.capTable;
  this_00 = &this->arena;
  kj::Arena::Arena(this_00,0x400);
  (this->parsers).statementSequence.parser = (void *)0x0;
  (this->parsers).statementSequence.wrapper = (Wrapper *)0x0;
  (this->parsers).statement.parser = (void *)0x0;
  (this->parsers).statement.wrapper = (Wrapper *)0x0;
  (this->parsers).tokenSequence.parser = (void *)0x0;
  (this->parsers).tokenSequence.wrapper = (Wrapper *)0x0;
  (this->parsers).token.parser = (void *)0x0;
  (this->parsers).token.wrapper = (Wrapper *)0x0;
  (this->parsers).emptySpace.parser = (void *)0x0;
  (this->parsers).emptySpace.wrapper = (Wrapper *)0x0;
  plVar2 = (long *)kj::Arena::allocateBytes(this_00,0x30,8,false);
  pPVar1 = &(this->parsers).tokenSequence;
  *plVar2 = (long)pPVar1;
  plVar2[2] = (long)pPVar1;
  local_58.bits[2] = 0;
  local_58.bits[3] = 0;
  local_58.bits[0] = 0;
  local_58.bits[1] = 0;
  kj::parse::CharGroup_::orAny(&local_78,&local_58,"!$%&*+-./:<=>?@^|~");
  puVar3 = (undefined8 *)kj::Arena::allocateBytes(this_00,0xe8,8,false);
  *puVar3 = kj::parse::identifier;
  puVar3[1] = this;
  puVar3[2] = kj::parse::doubleQuotedString;
  puVar3[3] = this;
  puVar3[4] = kj::parse::doubleQuotedHexBinary;
  puVar3[5] = this;
  puVar3[6] = kj::parse::integer;
  puVar3[7] = this;
  puVar3[8] = kj::parse::number;
  puVar3[9] = this;
  puVar3[10] = local_78.bits[0];
  puVar3[0xb] = local_78.bits[1];
  puVar3[0xc] = local_78.bits[2];
  puVar3[0xd] = local_78.bits[3];
  puVar3[0xe] = local_88;
  puVar3[0xf] = this;
  puVar3[0x11] = plVar2;
  puVar3[0x13] = this;
  puVar3[0x15] = plVar2;
  puVar3[0x17] = this;
  puVar3[0x1a] = errorReporter;
  puVar4 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x28,8,false);
  *puVar4 = (anonymous_namespace)::commentsAndWhitespace;
  puVar4[1] = puVar3;
  puVar4[2] = (anonymous_namespace)::commentsAndWhitespace;
  (this->parsers).tokenSequence.parser = puVar4;
  (this->parsers).tokenSequence.wrapper =
       &kj::parse::
        ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
        ::WrapperImplInstance<$5dc27cb6$>::instance.super_Wrapper;
  pvVar5 = kj::Arena::allocateBytes(this_00,0x60,8,false);
  *(undefined1 **)((long)pvVar5 + 8) = (anonymous_namespace)::docComment;
  *(Lexer **)((long)pvVar5 + 0x18) = this;
  *(undefined1 **)((long)pvVar5 + 0x28) = (anonymous_namespace)::docComment;
  *(Parser<kj::Array<Orphan<Statement>_>_> **)((long)pvVar5 + 0x30) =
       &(this->parsers).statementSequence;
  *(undefined1 **)((long)pvVar5 + 0x40) = (anonymous_namespace)::docComment;
  *(Lexer **)((long)pvVar5 + 0x50) = this;
  plVar2 = (long *)kj::Arena::allocateBytes(this_00,0x20,8,false);
  *plVar2 = (long)pPVar1;
  plVar2[1] = (long)pvVar5;
  puVar4 = (undefined8 *)kj::Arena::allocateBytes(this_00,0x28,8,false);
  *puVar4 = (anonymous_namespace)::commentsAndWhitespace;
  puVar4[1] = plVar2;
  puVar4[2] = (anonymous_namespace)::commentsAndWhitespace;
  (this->parsers).statementSequence.parser = puVar4;
  (this->parsers).statementSequence.wrapper =
       &kj::parse::
        ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>
        ::WrapperImplInstance<$697d36a$>::instance.super_Wrapper;
  (this->parsers).token.parser = puVar3;
  (this->parsers).token.wrapper =
       &kj::parse::
        ParserRef<capnp::compiler::Lexer::ParserInput,_capnp::Orphan<capnp::compiler::Token>_>::
        WrapperImplInstance<$a58e5a6f$>::instance.super_Wrapper;
  (this->parsers).statement.parser = plVar2;
  (this->parsers).statement.wrapper =
       &kj::parse::
        ParserRef<capnp::compiler::Lexer::ParserInput,_capnp::Orphan<capnp::compiler::Statement>_>::
        WrapperImplInstance<$dc9fac13$>::instance.super_Wrapper;
  (this->parsers).emptySpace.parser = (anonymous_namespace)::commentsAndWhitespace;
  (this->parsers).emptySpace.wrapper =
       &kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::
        WrapperImplInstance<kj::parse::Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\xef'>,_kj::parse::ExactlyConst_<char,_'\xbb'>,_kj::parse::ExactlyConst_<char,_'\xbf'>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\xef'>,_kj::parse::ExactlyConst_<char,_'\xbb'>,_kj::parse::ExactlyConst_<char,_'\xbf'>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>_>
        ::instance.super_Wrapper;
  return;
}

Assistant:

Lexer::Lexer(Orphanage orphanageParam, ErrorReporter& errorReporter)
    : orphanage(orphanageParam) {

  // Note that because passing an lvalue to a parser constructor uses it by-referencee, it's safe
  // for us to use parsers.tokenSequence even though we haven't yet constructed it.
  auto& tokenSequence = parsers.tokenSequence;

  auto& commaDelimitedList = arena.copy(p::transform(
      p::sequence(tokenSequence, p::many(p::sequence(p::exactChar<','>(), tokenSequence))),
      [](kj::Array<Orphan<Token>>&& first, kj::Array<kj::Array<Orphan<Token>>>&& rest)
          -> kj::Array<kj::Array<Orphan<Token>>> {
        if (first == nullptr && rest == nullptr) {
          // Completely empty list.
          return nullptr;
        } else {
          uint restSize = rest.size();
          if (restSize > 0 && rest[restSize - 1] == nullptr) {
            // Allow for trailing commas by shortening the list by one item if the final token is
            // nullptr
            restSize--;
          }
          auto result = kj::heapArrayBuilder<kj::Array<Orphan<Token>>>(1 + restSize); // first+rest
          result.add(kj::mv(first));
          for (uint i = 0; i < restSize ; i++) {
            result.add(kj::mv(rest[i]));
          }
          return result.finish();
        }
      }));

  auto& token = arena.copy(p::oneOf(
      p::transformWithLocation(p::identifier,
          [this](Location loc, kj::String name) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setIdentifier(name);
            return t;
          }),
      p::transformWithLocation(p::doubleQuotedString,
          [this](Location loc, kj::String text) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setStringLiteral(text);
            return t;
          }),
      p::transformWithLocation(p::doubleQuotedHexBinary,
          [this](Location loc, kj::Array<byte> data) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setBinaryLiteral(data);
            return t;
          }),
      p::transformWithLocation(p::integer,
          [this](Location loc, uint64_t i) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setIntegerLiteral(i);
            return t;
          }),
      p::transformWithLocation(p::number,
          [this](Location loc, double x) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setFloatLiteral(x);
            return t;
          }),
      p::transformWithLocation(
          p::charsToString(p::oneOrMore(p::anyOfChars("!$%&*+-./:<=>?@^|~"))),
          [this](Location loc, kj::String text) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setOperator(text);
            return t;
          }),
      p::transformWithLocation(
          sequence(p::exactChar<'('>(), commaDelimitedList, p::exactChar<')'>()),
          [this](Location loc, kj::Array<kj::Array<Orphan<Token>>>&& items) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            buildTokenSequenceList(
                initTok(t, loc).initParenthesizedList(items.size()), kj::mv(items));
            return t;
          }),
      p::transformWithLocation(
          sequence(p::exactChar<'['>(), commaDelimitedList, p::exactChar<']'>()),
          [this](Location loc, kj::Array<kj::Array<Orphan<Token>>>&& items) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            buildTokenSequenceList(
                initTok(t, loc).initBracketedList(items.size()), kj::mv(items));
            return t;
          }),
      p::transformOrReject(p::transformWithLocation(
          p::oneOf(sequence(p::exactChar<'\xff'>(), p::exactChar<'\xfe'>()),
                   sequence(p::exactChar<'\xfe'>(), p::exactChar<'\xff'>()),
                   sequence(p::exactChar<'\x00'>())),
          [&errorReporter](Location loc) -> kj::Maybe<Orphan<Token>> {
            errorReporter.addError(loc.begin(), loc.end(),
                "Non-UTF-8 input detected. Cap'n Proto schema files must be UTF-8 text.");
            return nullptr;
          }), [](kj::Maybe<Orphan<Token>> param) { return param; })));
  parsers.tokenSequence = arena.copy(p::sequence(
      commentsAndWhitespace, p::many(p::sequence(token, commentsAndWhitespace))));

  auto& statementSequence = parsers.statementSequence;

  auto& statementEnd = arena.copy(p::oneOf(
      transform(p::sequence(p::exactChar<';'>(), docComment),
          [this](kj::Maybe<kj::Array<kj::String>>&& comment) -> Orphan<Statement> {
            auto result = orphanage.newOrphan<Statement>();
            auto builder = result.get();
            KJ_IF_MAYBE(c, comment) {
              attachDocComment(builder, kj::mv(*c));
            }
            builder.setLine();
            return result;
          }),
      transform(
          p::sequence(p::exactChar<'{'>(), docComment, statementSequence, p::exactChar<'}'>(),
                      docComment),
          [this](kj::Maybe<kj::Array<kj::String>>&& comment,
                 kj::Array<Orphan<Statement>>&& statements,
                 kj::Maybe<kj::Array<kj::String>>&& lateComment)
              -> Orphan<Statement> {
            auto result = orphanage.newOrphan<Statement>();
            auto builder = result.get();
            KJ_IF_MAYBE(c, comment) {
              attachDocComment(builder, kj::mv(*c));
            } else KJ_IF_MAYBE(c, lateComment) {
              attachDocComment(builder, kj::mv(*c));
            }
            auto list = builder.initBlock(statements.size());
            for (uint i = 0; i < statements.size(); i++) {
              list.adoptWithCaveats(i, kj::mv(statements[i]));
            }
            return result;
          })
      ));

  auto& statement = arena.copy(p::transformWithLocation(p::sequence(tokenSequence, statementEnd),
      [](Location loc, kj::Array<Orphan<Token>>&& tokens, Orphan<Statement>&& statement) {
        auto builder = statement.get();
        auto tokensBuilder = builder.initTokens(tokens.size());
        for (uint i = 0; i < tokens.size(); i++) {
          tokensBuilder.adoptWithCaveats(i, kj::mv(tokens[i]));
        }
        builder.setStartByte(loc.begin());
        builder.setEndByte(loc.end());
        return kj::mv(statement);
      }));

  parsers.statementSequence = arena.copy(sequence(
      commentsAndWhitespace, many(sequence(statement, commentsAndWhitespace))));

  parsers.token = token;
  parsers.statement = statement;
  parsers.emptySpace = commentsAndWhitespace;
}